

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::NonPackedFixed32::Clear(NonPackedFixed32 *this)

{
  uint32_t cached_has_bits;
  NonPackedFixed32 *this_local;
  
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_fixed32_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void NonPackedFixed32::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.NonPackedFixed32)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_fixed32_.Clear();
  _internal_metadata_.Clear<std::string>();
}